

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellRegisterRootNamespaces(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr root,xmlNodePtr node2)

{
  xmlNs *local_38;
  xmlNsPtr ns;
  xmlNodePtr node2_local;
  xmlNodePtr root_local;
  char *arg_local;
  xmlShellCtxtPtr ctxt_local;
  
  if ((((root == (xmlNodePtr)0x0) || (root->type != XML_ELEMENT_NODE)) ||
      (root->nsDef == (xmlNs *)0x0)) ||
     ((ctxt == (xmlShellCtxtPtr)0x0 || (ctxt->pctxt == (xmlXPathContextPtr_conflict)0x0)))) {
    ctxt_local._4_4_ = -1;
  }
  else {
    for (local_38 = root->nsDef; local_38 != (xmlNs *)0x0; local_38 = local_38->next) {
      if (local_38->prefix == (xmlChar *)0x0) {
        xmlXPathRegisterNs(ctxt->pctxt,(xmlChar *)"defaultns",local_38->href);
      }
      else {
        xmlXPathRegisterNs(ctxt->pctxt,local_38->prefix,local_38->href);
      }
    }
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlShellRegisterRootNamespaces(xmlShellCtxtPtr ctxt, char *arg ATTRIBUTE_UNUSED,
      xmlNodePtr root, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNsPtr ns;

    if ((root == NULL) || (root->type != XML_ELEMENT_NODE) ||
        (root->nsDef == NULL) || (ctxt == NULL) || (ctxt->pctxt == NULL))
	return(-1);
    ns = root->nsDef;
    while (ns != NULL) {
        if (ns->prefix == NULL)
	    xmlXPathRegisterNs(ctxt->pctxt, BAD_CAST "defaultns", ns->href);
	else
	    xmlXPathRegisterNs(ctxt->pctxt, ns->prefix, ns->href);
        ns = ns->next;
    }
    return(0);
}